

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall clog::Logger::~Logger(Logger *this)

{
  pointer pIVar1;
  Buffer *this_00;
  char *logline;
  size_t len;
  FixBuffer<4096> *buffer;
  Logger *this_local;
  
  pIVar1 = std::unique_ptr<clog::Logger::Impl,_std::default_delete<clog::Logger::Impl>_>::operator->
                     (&this->_pImpl);
  Impl::finish(pIVar1);
  pIVar1 = std::unique_ptr<clog::Logger::Impl,_std::default_delete<clog::Logger::Impl>_>::operator->
                     (&this->_pImpl);
  this_00 = LogStream::buffer(&pIVar1->_stream);
  logline = detail::FixBuffer<4096>::data(this_00);
  len = detail::FixBuffer<4096>::size(this_00);
  AsyncLogger::append((AsyncLogger *)logger,logline,len);
  pIVar1 = std::unique_ptr<clog::Logger::Impl,_std::default_delete<clog::Logger::Impl>_>::operator->
                     (&this->_pImpl);
  if (pIVar1->_level == FATAL) {
    abort();
  }
  std::unique_ptr<clog::Logger::Impl,_std::default_delete<clog::Logger::Impl>_>::~unique_ptr
            (&this->_pImpl);
  return;
}

Assistant:

Logger::~Logger()
{
    _pImpl->finish();
    const detail::FixBuffer<detail::kSmallBuffer>& buffer(_pImpl->_stream.buffer());
    
    logger.append(buffer.data(), buffer.size());

    if (_pImpl->_level == FATAL)
    {
        abort();
    }
}